

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

QPDF_BOOL qpdf_oh_is_dictionary_of_type(qpdf_data qpdf,qpdf_oh oh,char *type,char *subtype)

{
  int iVar1;
  char *local_98;
  anon_class_16_2_f88c31fe local_80;
  function<int_(QPDFObjectHandle_&)> local_70;
  function<int_()> local_50;
  char *local_30;
  char *stype;
  char *subtype_local;
  char *type_local;
  qpdf_data p_Stack_10;
  qpdf_oh oh_local;
  qpdf_data qpdf_local;
  
  local_98 = subtype;
  if (subtype == (char *)0x0) {
    local_98 = "";
  }
  local_30 = local_98;
  stype = subtype;
  subtype_local = type;
  type_local._4_4_ = oh;
  p_Stack_10 = qpdf;
  std::function<int()>::function<int(&)(),void>((function<int()> *)&local_50,return_false);
  local_80.type = subtype_local;
  local_80.stype = local_30;
  std::function<int(QPDFObjectHandle&)>::function<qpdf_oh_is_dictionary_of_type::__0,void>
            ((function<int(QPDFObjectHandle&)> *)&local_70,&local_80);
  iVar1 = do_with_oh<int>(qpdf,oh,&local_50,&local_70);
  std::function<int_(QPDFObjectHandle_&)>::~function(&local_70);
  std::function<int_()>::~function(&local_50);
  return iVar1;
}

Assistant:

QPDF_BOOL
qpdf_oh_is_dictionary_of_type(qpdf_data qpdf, qpdf_oh oh, char const* type, char const* subtype)
{
    auto stype = (subtype == nullptr) ? "" : subtype;
    return do_with_oh<QPDF_BOOL>(qpdf, oh, return_false, [type, stype](QPDFObjectHandle& o) {
        QTC::TC("qpdf", "qpdf-c called qpdf_oh_is_dictionary_of_type");
        return o.isDictionaryOfType(type, stype);
    });
}